

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcCraneRailFShapeProfileDef::~IfcCraneRailFShapeProfileDef
          (IfcCraneRailFShapeProfileDef *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcParameterizedProfileDef.field_0x80 = 0x89f038;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x68 = 0x89f060
  ;
  if ((Out *)this[-1].WebThickness != &this[-1].BaseDepth2) {
    operator_delete((undefined1 *)this[-1].WebThickness,(long)this[-1].BaseDepth2 + 1);
  }
  puVar1 = (undefined1 *)this[-1].Radius.ptr;
  if ((Out *)puVar1 != &this[-1].HeadDepth2) {
    operator_delete(puVar1,(long)this[-1].HeadDepth2 + 1);
  }
  operator_delete(&this[-1].super_IfcParameterizedProfileDef.field_0x80,0xf0);
  return;
}

Assistant:

IfcCraneRailFShapeProfileDef() : Object("IfcCraneRailFShapeProfileDef") {}